

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O1

LinTerms * __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::SplitLinTerms(LinTerms *__return_storage_ptr__,
               Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *this,LinTerms *ltin,LinTerms *lt_out_vars)

{
  int v;
  size_ty sVar1;
  ptr piVar2;
  bool bVar3;
  long lVar4;
  size_ty request;
  ulong uVar5;
  uint uVar6;
  int local_54;
  LinTerms *local_50;
  LinTerms *local_48;
  FlatModel<mp::DefaultFlatModelParams> *local_40;
  double local_38;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  uVar5 = 0;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  sVar1 = (ltin->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  local_40 = (FlatModel<mp::DefaultFlatModelParams> *)this;
  if (sVar1 != 0) {
    piVar2 = (ltin->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    lVar4 = 0;
    local_50 = __return_storage_ptr__;
    local_48 = lt_out_vars;
    do {
      bVar3 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                        ((FlatModel<mp::DefaultFlatModelParams> *)
                         &this[-8].MarkVarIfLogical_._M_invoker,*(int *)((long)piVar2 + lVar4));
      uVar6 = (int)uVar5 + (uint)bVar3;
      uVar5 = (ulong)uVar6;
      lVar4 = lVar4 + 4;
    } while (sVar1 << 2 != lVar4);
    uVar5 = (ulong)uVar6;
    __return_storage_ptr__ = local_50;
    lt_out_vars = local_48;
  }
  gch::detail::small_vector_base<std::allocator<double>,_6U>::request_capacity
            ((small_vector_base<std::allocator<double>,_6U> *)lt_out_vars,uVar5);
  local_48 = (LinTerms *)&lt_out_vars->vars_;
  gch::detail::small_vector_base<std::allocator<int>,_6U>::request_capacity
            ((small_vector_base<std::allocator<int>,_6U> *)local_48,uVar5);
  request = (ltin->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size - uVar5;
  gch::detail::small_vector_base<std::allocator<double>,_6U>::request_capacity
            ((small_vector_base<std::allocator<double>,_6U> *)__return_storage_ptr__,request);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::request_capacity
            (&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>,
             request);
  if ((ltin->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
    local_40 = (FlatModel<mp::DefaultFlatModelParams> *)
               &(((Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   *)((long)local_40 + -0x240))->MarkVarIfLogical_)._M_invoker;
    uVar5 = 0;
    do {
      local_50 = (LinTerms *)
                 (ltin->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar5];
      if (((double)local_50 != 0.0) || (NAN((double)local_50))) {
        v = (ltin->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar5];
        bVar3 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar(local_40,v);
        local_54 = v;
        if (bVar3) {
          local_38 = (double)local_50;
          gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                    ((small_vector_base<std::allocator<double>,6u> *)lt_out_vars,&local_38);
          gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                    ((small_vector_base<std::allocator<int>,6u> *)local_48,&local_54);
        }
        else {
          local_38 = (double)local_50;
          gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                    ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,
                     &local_38);
          gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                    ((small_vector_base<std::allocator<int>,6u> *)&__return_storage_ptr__->vars_,
                     &local_54);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ltin->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                     super_small_vector_data_base<double_*,_unsigned_long>.m_size);
  }
  return __return_storage_ptr__;
}

Assistant:

LinTerms SplitLinTerms(const LinTerms& ltin, LinTerms& lt_out_vars) {
    LinTerms result;
    int nvars=0;
    for (int v: ltin.vars())
      if (MPCD( IsProperVar(v) ))
        ++nvars;
    lt_out_vars.reserve(nvars);
    result.reserve(ltin.size() - nvars);
    int v=0;
    double c=0.0;
    for (size_t i=0; i<ltin.size(); ++i) {
      if ((c = ltin.coef(i))) {                       // non-0
        if (MPCD( IsProperVar(v = ltin.var(i)) )) {
          lt_out_vars.add_term(c, v);
        } else {
          result.add_term(c, v);
        }
      }
    }
    return result;
  }